

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.h
# Opt level: O1

void __thiscall
ExprVariableAccess::ExprVariableAccess
          (ExprVariableAccess *this,SynBase *source,TypeBase *type,VariableData *variable)

{
  (this->super_ExprBase).typeID = 0x22;
  (this->super_ExprBase).source = source;
  (this->super_ExprBase).type = type;
  (this->super_ExprBase).next = (ExprBase *)0x0;
  (this->super_ExprBase).listed = false;
  (this->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_00229b00;
  this->variable = variable;
  if (variable == (VariableData *)0x0) {
    __assert_fail("variable",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.h"
                  ,0x3a9,
                  "ExprVariableAccess::ExprVariableAccess(SynBase *, TypeBase *, VariableData *)");
  }
  if (variable->type == type) {
    if (variable->lookupOnly != true) {
      return;
    }
    __assert_fail("!variable->lookupOnly",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.h"
                  ,0x3ab,
                  "ExprVariableAccess::ExprVariableAccess(SynBase *, TypeBase *, VariableData *)");
  }
  __assert_fail("type == variable->type",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.h"
                ,0x3aa,
                "ExprVariableAccess::ExprVariableAccess(SynBase *, TypeBase *, VariableData *)");
}

Assistant:

ExprVariableAccess(SynBase *source, TypeBase *type, VariableData *variable): ExprBase(myTypeID, source, type), variable(variable)
	{
		assert(variable);
		assert(type == variable->type);
		assert(!variable->lookupOnly);
	}